

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O3

void find_strap(char *filename)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  
  pcVar2 = strrchr(filename,0x2f);
  iVar1 = (int)pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    iVar1 = (int)filename;
  }
  __n = (size_t)(iVar1 - (int)filename);
  pcVar2 = (char *)malloc(__n + 0xb);
  strncpy(pcVar2,filename,__n);
  builtin_strncpy(pcVar2 + __n,"strap_peek",0xb);
  iVar1 = set_strap_from_file(pcVar2);
  if (iVar1 == 0) {
    printf("Strap register found in \'%s\'\n",pcVar2);
  }
  free(pcVar2);
  return;
}

Assistant:

void find_strap(char *filename) {
	char *path;
	const char * strap_filename = "strap_peek";
	const char *pos = strrchr(filename, '/');
	if (pos == NULL)
		pos = filename;
	else
		pos++;
	int base_length = pos-filename;

	path = (char*) malloc(base_length + strlen(strap_filename)+1);
	strncpy(path, filename, base_length);
	strncpy(path+base_length, strap_filename, strlen(strap_filename)+1);

	if (!set_strap_from_file(path))
		printf("Strap register found in '%s'\n", path);

	free(path);
}